

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.hpp
# Opt level: O0

char * __thiscall Omega_h::Write<signed_char>::operator[](Write<signed_char> *this,LO i)

{
  LO i_local;
  Write<signed_char> *this_local;
  
  return (char *)((long)(this->shared_alloc_).direct_ptr + (long)i);
}

Assistant:

OMEGA_H_DEVICE T& operator[](LO i) const OMEGA_H_NOEXCEPT {
#ifdef OMEGA_H_CHECK_BOUNDS
    OMEGA_H_CHECK_OP(0, <=, i);
    OMEGA_H_CHECK_OP(i, <, size());
#endif
#ifdef OMEGA_H_USE_KOKKOS
    return view_(i);
#else
    return data()[i];
#endif
  }